

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__gif_test(stbi__context *s)

{
  int iVar1;
  stbi_uc *psVar2;
  stbi_uc *psVar3;
  stbi_uc sVar4;
  uint uVar5;
  uint uVar6;
  stbi_uc *psVar8;
  uint uVar7;
  
  psVar8 = s->img_buffer;
  psVar3 = s->img_buffer_end;
  if (psVar8 < psVar3) {
    psVar2 = psVar8 + 1;
    s->img_buffer = psVar2;
    sVar4 = *psVar8;
  }
  else {
    if (s->read_from_callbacks == 0) {
      uVar5 = 0;
      goto LAB_0010855d;
    }
    psVar3 = s->buffer_start;
    iVar1 = (*(s->io).read)(s->io_user_data,(char *)psVar3,s->buflen);
    if (iVar1 == 0) {
      s->read_from_callbacks = 0;
      psVar3 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      sVar4 = '\0';
    }
    else {
      sVar4 = *psVar3;
      psVar3 = psVar3 + iVar1;
    }
    psVar2 = s->buffer_start + 1;
    s->img_buffer_end = psVar3;
    s->img_buffer = psVar2;
  }
  uVar6 = 0;
  uVar7 = 0;
  uVar5 = uVar6;
  if (sVar4 == 'G') {
    if (psVar2 < psVar3) {
      psVar8 = psVar2 + 1;
      s->img_buffer = psVar8;
      sVar4 = *psVar2;
    }
    else {
      uVar5 = uVar7;
      if (s->read_from_callbacks == 0) goto LAB_0010855d;
      psVar3 = s->buffer_start;
      iVar1 = (*(s->io).read)(s->io_user_data,(char *)psVar3,s->buflen);
      if (iVar1 == 0) {
        s->read_from_callbacks = 0;
        psVar3 = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
        sVar4 = '\0';
      }
      else {
        sVar4 = *psVar3;
        psVar3 = psVar3 + iVar1;
      }
      psVar8 = s->buffer_start + 1;
      s->img_buffer_end = psVar3;
      s->img_buffer = psVar8;
    }
    uVar5 = uVar6;
    if (sVar4 == 'I') {
      if (psVar8 < psVar3) {
        psVar2 = psVar8 + 1;
        s->img_buffer = psVar2;
        sVar4 = *psVar8;
      }
      else {
        uVar5 = uVar7;
        if (s->read_from_callbacks == 0) goto LAB_0010855d;
        psVar3 = s->buffer_start;
        iVar1 = (*(s->io).read)(s->io_user_data,(char *)psVar3,s->buflen);
        if (iVar1 == 0) {
          s->read_from_callbacks = 0;
          psVar3 = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
          sVar4 = '\0';
        }
        else {
          sVar4 = *psVar3;
          psVar3 = psVar3 + iVar1;
        }
        psVar2 = s->buffer_start + 1;
        s->img_buffer_end = psVar3;
        s->img_buffer = psVar2;
      }
      uVar5 = uVar6;
      if (sVar4 == 'F') {
        if (psVar2 < psVar3) {
          psVar8 = psVar2 + 1;
          s->img_buffer = psVar8;
          sVar4 = *psVar2;
        }
        else {
          uVar5 = uVar7;
          if (s->read_from_callbacks == 0) goto LAB_0010855d;
          psVar3 = s->buffer_start;
          iVar1 = (*(s->io).read)(s->io_user_data,(char *)psVar3,s->buflen);
          if (iVar1 == 0) {
            s->read_from_callbacks = 0;
            psVar3 = s->buffer_start + 1;
            s->buffer_start[0] = '\0';
            sVar4 = '\0';
          }
          else {
            sVar4 = *psVar3;
            psVar3 = psVar3 + iVar1;
          }
          psVar8 = s->buffer_start + 1;
          s->img_buffer_end = psVar3;
          s->img_buffer = psVar8;
        }
        uVar5 = uVar7;
        if (sVar4 == '8') {
          if (psVar8 < psVar3) {
            psVar2 = psVar8 + 1;
            s->img_buffer = psVar2;
            sVar4 = *psVar8;
          }
          else {
            if (s->read_from_callbacks == 0) goto LAB_0010855d;
            psVar3 = s->buffer_start;
            iVar1 = (*(s->io).read)(s->io_user_data,(char *)psVar3,s->buflen);
            if (iVar1 == 0) {
              s->read_from_callbacks = 0;
              psVar3 = s->buffer_start + 1;
              s->buffer_start[0] = '\0';
              sVar4 = '\0';
            }
            else {
              sVar4 = *psVar3;
              psVar3 = psVar3 + iVar1;
            }
            psVar2 = s->buffer_start + 1;
            s->img_buffer_end = psVar3;
            s->img_buffer = psVar2;
          }
          if ((sVar4 == '9') || (sVar4 == '7')) {
            if (psVar2 < psVar3) {
              s->img_buffer = psVar2 + 1;
              sVar4 = *psVar2;
            }
            else {
              if (s->read_from_callbacks == 0) goto LAB_0010855d;
              psVar3 = s->buffer_start;
              iVar1 = (*(s->io).read)(s->io_user_data,(char *)psVar3,s->buflen);
              if (iVar1 == 0) {
                s->read_from_callbacks = 0;
                psVar3 = s->buffer_start + 1;
                s->buffer_start[0] = '\0';
                sVar4 = '\0';
              }
              else {
                sVar4 = *psVar3;
                psVar3 = psVar3 + iVar1;
              }
              s->img_buffer_end = psVar3;
              s->img_buffer = s->buffer_start + 1;
            }
            uVar5 = (uint)(sVar4 == 'a');
          }
        }
      }
    }
  }
LAB_0010855d:
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  return uVar5;
}

Assistant:

static int stbi__gif_test(stbi__context *s)
{
   int r = stbi__gif_test_raw(s);
   stbi__rewind(s);
   return r;
}